

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int isoent_gen_iso9660_identifier(archive_write *a,isoent *isoent,idr *idr)

{
  byte bVar1;
  uint uVar2;
  void *pvVar3;
  isoent *piVar4;
  isofile *piVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  byte *__dest;
  size_t sVar9;
  char *pcVar10;
  int iVar11;
  uint weight;
  byte *pbVar12;
  anon_struct_24_3_5bfd2c4c_for_children *paVar13;
  byte *pbVar14;
  byte *pbVar15;
  uint uVar16;
  anon_struct_24_3_5bfd2c4c_for_children *paVar17;
  uint uVar18;
  ulong uVar19;
  size_t sVar20;
  size_t sVar21;
  byte *__s;
  char cVar22;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  size_t local_90;
  size_t local_80;
  
  iVar7 = (isoent->children).cnt;
  if (iVar7 != 0) {
    pvVar3 = a->format_data;
    uVar2 = *(uint *)((long)pvVar3 + 0x10370);
    uVar18 = uVar2 >> 0xe & 7;
    if (uVar18 < 4) {
      local_80 = 0x1e;
      if (uVar18 == 1) {
        local_80 = 8;
      }
      local_90 = 0x1f;
      uVar16 = 0x1f;
      if (uVar18 == 1) {
        uVar16 = 8;
        local_90 = 0xc;
      }
      cVar22 = (uVar2 & 4) == 0;
    }
    else {
      local_90 = 0xc1;
      if ((uVar2 & 0x1800000) == 0) {
        local_90 = 0xcf;
      }
      cVar22 = true;
      uVar16 = (uint)local_90;
      local_80 = local_90;
    }
    iVar7 = idr_start(a,idr,iVar7,3,1,0x2990b0,
                      (archive_rb_tree_ops *)
                      CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    if (iVar7 < 0) {
      return iVar7;
    }
    uVar2 = (uint)local_80;
    iVar7 = (int)local_90;
    paVar13 = &isoent->children;
    paVar17 = paVar13;
    while (piVar4 = paVar17->first, piVar4 != (isoent *)0x0) {
      piVar5 = piVar4->file;
      sVar20 = (piVar5->basename).length;
      __dest = (byte *)malloc((long)((sVar20 << 0x20) + 0x2200000000) >> 0x20);
      if (__dest == (byte *)0x0) {
        archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
        return -0x1e;
      }
      sVar21 = (long)(sVar20 << 0x20) >> 0x20;
      memcpy(__dest,(piVar5->basename).s,sVar21);
      __dest[sVar21] = 0;
      piVar4->identifier = (char *)__dest;
      if ((uVar18 < 4) && (*__dest == 0x2e)) {
        *__dest = 0x5f;
        __dest = __dest + 1;
      }
      pbVar14 = (byte *)0x0;
      __s = (byte *)0x0;
      while( true ) {
        bVar1 = *__dest;
        uVar19 = (ulong)bVar1;
        if (uVar19 == 0) break;
        if ((char)bVar1 < '\0') {
LAB_0016a1a1:
          *__dest = 0x5f;
          pbVar12 = __s;
          pbVar15 = pbVar14;
        }
        else {
          pbVar12 = __s;
          pbVar15 = pbVar14;
          if (idr->char_map[uVar19] == '\0') {
            if ((byte)(bVar1 + 0x9f) < 0x1a) {
              *__dest = bVar1 - 0x20;
            }
            else if ((uVar18 < 4) || (pbVar12 = __dest, pbVar15 = __s, bVar1 != 0x2e)) {
              if (bVar1 == 0x2e) {
                pbVar14 = __s;
              }
              if (uVar19 == 0x2e) {
                __s = __dest;
              }
              goto LAB_0016a1a1;
            }
          }
          else {
            if (bVar1 == 0x2e) {
              pbVar12 = __dest;
            }
            if (uVar19 == 0x2e) {
              pbVar15 = __s;
            }
          }
        }
        __dest = __dest + 1;
        pbVar14 = pbVar15;
        __s = pbVar12;
      }
      pcVar10 = piVar4->identifier;
      iVar11 = (int)sVar20;
      if (__s == (byte *)0x0) {
        uVar6 = uVar16;
        if ((piVar4->field_0xe8 & 2) == 0) {
          uVar6 = uVar2;
        }
        sVar9 = (size_t)uVar6;
        weight = 0xffffffff;
        if ((int)uVar6 < iVar11) {
          pcVar10[uVar6] = '\0';
LAB_0016a2e1:
          sVar20 = sVar9;
          weight = (uint)sVar9;
        }
      }
      else {
        *__s = 0x2e;
        uVar19 = (long)__s - (long)pcVar10;
        sVar20 = uVar19;
        if ((*(uint *)((long)pvVar3 + 0x10370) & 0x1c000) == 0x4000) {
          if (8 < (long)uVar19) {
            pcVar10[8] = '.';
            pcVar10[9] = __s[1];
            pcVar10[10] = __s[2];
            pcVar10[0xb] = __s[3];
            pcVar10[0xc] = '\0';
            sVar9 = 8;
            goto LAB_0016a2e1;
          }
          sVar21 = strlen((char *)__s);
          if (sVar21 < 5) {
LAB_0016a305:
            weight = 0xffffffff;
          }
          else {
            __s[4] = 0;
            weight = 0;
          }
        }
        else if ((piVar4->field_0xe8 & 2) == 0) {
          weight = 0xffffffff;
          if (iVar7 < iVar11) {
            sVar21 = strlen((char *)__s);
            iVar11 = (int)pbVar14 - (int)pcVar10;
            if (pbVar14 == (byte *)0x0) {
              iVar11 = 0;
            }
            iVar8 = (int)sVar21;
            if ((iVar8 < 2) || ((int)(uVar2 - 1) <= iVar11)) {
              pcVar10[local_80] = '\0';
              sVar20 = local_80;
              weight = uVar2;
            }
            else {
              iVar11 = iVar8;
              if (iVar7 < iVar8) {
                iVar11 = iVar7;
              }
              sVar20 = (size_t)(uint)(iVar7 - iVar11);
              if (iVar7 <= iVar8) {
                sVar20 = 1;
              }
              memmove(pcVar10 + (int)(uint)sVar20,__s,(ulong)(iVar11 - (uint)(iVar7 <= iVar8)));
              pcVar10[local_90] = '\0';
              weight = (uint)sVar20;
            }
          }
        }
        else {
          if (iVar11 <= (int)uVar16) goto LAB_0016a305;
          pcVar10[uVar16] = '\0';
          sVar20 = uVar19 & 0xffffffff;
          weight = uVar16;
          if ((int)uVar16 < (int)uVar19) {
            sVar20 = (size_t)uVar16;
          }
        }
      }
      iVar11 = (int)sVar20;
      piVar4->ext_off = iVar11;
      sVar21 = strlen(pcVar10 + iVar11);
      piVar4->ext_len = (int)sVar21;
      iVar8 = (int)sVar21 + iVar11;
      piVar4->id_len = iVar8;
      if ((*(uint *)((long)pvVar3 + 0x10370) & 0x1c000) == 0x4000) {
        if (4 < iVar11) {
          iVar11 = 5;
        }
      }
      else if (iVar8 == iVar7) {
        iVar11 = iVar11 + -3;
      }
      else if (iVar8 == iVar7 + -1) {
        iVar11 = iVar11 + -2;
      }
      else {
        iVar11 = iVar11 - (uint)(iVar8 == iVar7 + -2);
      }
      idr_register(idr,piVar4,weight,iVar11);
      paVar17 = (anon_struct_24_3_5bfd2c4c_for_children *)&piVar4->chnext;
    }
    idr_resolve(idr,idr_set_num);
    while (piVar4 = paVar13->first, piVar4 != (isoent *)0x0) {
      if (((piVar4->field_0xe8 & 2) == 0) && (piVar4->rr_child == (isoent *)0x0)) {
        iVar7 = piVar4->ext_len;
        pcVar10 = piVar4->identifier + (long)iVar7 + (long)piVar4->ext_off;
        if ((uVar18 < 4) && (iVar7 == 0)) {
          *pcVar10 = '.';
          pcVar10 = pcVar10 + 1;
          iVar7 = 1;
LAB_0016a44e:
          piVar4->ext_len = iVar7;
        }
        else if ((3 < uVar18) && (iVar7 == 1)) {
          pcVar10[-1] = '\0';
          pcVar10 = pcVar10 + -1;
          iVar7 = 0;
          goto LAB_0016a44e;
        }
        piVar4->id_len = iVar7 + piVar4->ext_off;
        if (cVar22 == '\0') {
          pcVar10[0] = ';';
          pcVar10[1] = '1';
          pcVar10 = pcVar10 + 2;
          piVar4->id_len = piVar4->id_len + 2;
        }
        *pcVar10 = '\0';
        iVar7 = piVar4->id_len;
      }
      else {
        iVar7 = piVar4->ext_len + piVar4->ext_off;
        piVar4->id_len = iVar7;
      }
      piVar4->mb_len = iVar7;
      paVar13 = (anon_struct_24_3_5bfd2c4c_for_children *)&piVar4->chnext;
    }
  }
  return 0;
}

Assistant:

static int
isoent_gen_iso9660_identifier(struct archive_write *a, struct isoent *isoent,
    struct idr *idr)
{
	struct iso9660 *iso9660;
	struct isoent *np;
	char *p;
	int l, r;
	const char *char_map;
	char allow_ldots, allow_multidot, allow_period, allow_vernum;
	int fnmax, ffmax, dnmax;
	static const struct archive_rb_tree_ops rb_ops = {
		isoent_cmp_node_iso9660, isoent_cmp_key_iso9660
	};

	if (isoent->children.cnt == 0)
		return (0);

	iso9660 = a->format_data;
	char_map = idr->char_map;
	if (iso9660->opt.iso_level <= 3) {
		allow_ldots = 0;
		allow_multidot = 0;
		allow_period = 1;
		allow_vernum = iso9660->opt.allow_vernum;
		if (iso9660->opt.iso_level == 1) {
			fnmax = 8;
			ffmax = 12;/* fnmax + '.' + 3 */
			dnmax = 8;
		} else {
			fnmax = 30;
			ffmax = 31;
			dnmax = 31;
		}
	} else {
		allow_ldots = allow_multidot = 1;
		allow_period = allow_vernum = 0;
		if (iso9660->opt.rr)
			/*
			 * MDR : The maximum size of Directory Record(254).
			 * DRL : A Directory Record Length(33).
			 * CE  : A size of SUSP CE System Use Entry(28).
			 * MDR - DRL - CE = 254 - 33 - 28 = 193.
			 */
			fnmax = ffmax = dnmax = 193;
		else
			/*
			 * XA  : CD-ROM XA System Use Extension
			 *       Information(14).
			 * MDR - DRL - XA = 254 - 33 -14 = 207.
			 */
			fnmax = ffmax = dnmax = 207;
	}

	r = idr_start(a, idr, isoent->children.cnt, ffmax, 3, 1, &rb_ops);
	if (r < 0)
		return (r);

	for (np = isoent->children.first; np != NULL; np = np->chnext) {
		char *dot, *xdot;
		int ext_off, noff, weight;

		l = (int)np->file->basename.length;
		p = malloc(l+31+2+1);
		if (p == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
		memcpy(p, np->file->basename.s, l);
		p[l] = '\0';
		np->identifier = p;

		dot = xdot = NULL;
		if (!allow_ldots) {
			/*
			 * If there is a '.' character at the first byte,
			 * it has to be replaced by '_' character.
			 */
			if (*p == '.')
				*p++ = '_';
		}
		for (;*p; p++) {
			if (*p & 0x80) {
				*p = '_';
				continue;
			}
			if (char_map[(unsigned char)*p]) {
				/* if iso-level is '4', a character '.' is
				 * allowed by char_map. */
				if (*p == '.') {
					xdot = dot;
					dot = p;
				}
				continue;
			}
			if (*p >= 'a' && *p <= 'z') {
				*p -= 'a' - 'A';
				continue;
			}
			if (*p == '.') {
				xdot = dot;
				dot = p;
				if (allow_multidot)
					continue;
			}
			*p = '_';
		}
		p = np->identifier;
		weight = -1;
		if (dot == NULL) {
			int nammax;

			if (np->dir)
				nammax = dnmax;
			else
				nammax = fnmax;

			if (l > nammax) {
				p[nammax] = '\0';
				weight = nammax;
				ext_off = nammax;
			} else
				ext_off = l;
		} else {
			*dot = '.';
			ext_off = (int)(dot - p);

			if (iso9660->opt.iso_level == 1) {
				if (dot - p <= 8) {
					if (strlen(dot) > 4) {
						/* A length of a file extension
						 * must be less than 4 */
						dot[4] = '\0';
						weight = 0;
					}
				} else {
					p[8] = dot[0];
					p[9] = dot[1];
					p[10] = dot[2];
					p[11] = dot[3];
					p[12] = '\0';
					weight = 8;
					ext_off = 8;
				}
			} else if (np->dir) {
				if (l > dnmax) {
					p[dnmax] = '\0';
					weight = dnmax;
					if (ext_off > dnmax)
						ext_off = dnmax;
				}
			} else if (l > ffmax) {
				int extlen = (int)strlen(dot);
				int xdoff;

				if (xdot != NULL)
					xdoff = (int)(xdot - p);
				else
					xdoff = 0;

				if (extlen > 1 && xdoff < fnmax-1) {
					int off;

					if (extlen > ffmax)
						extlen = ffmax;
					off = ffmax - extlen;
					if (off == 0) {
						/* A dot('.')  character
						 * doesn't place to the first
						 * byte of identifier. */
						off ++;
						extlen --;
					}
					memmove(p+off, dot, extlen);
					p[ffmax] = '\0';
					ext_off = off;
					weight = off;
#ifdef COMPAT_MKISOFS
				} else if (xdoff >= fnmax-1) {
					/* Simulate a bug(?) of mkisofs. */
					p[fnmax-1] = '\0';
					ext_off = fnmax-1;
					weight = fnmax-1;
#endif
				} else {
					p[fnmax] = '\0';
					ext_off = fnmax;
					weight = fnmax;
				}
			}
		}
		/* Save an offset of a file name extension to sort files. */
		np->ext_off = ext_off;
		np->ext_len = (int)strlen(&p[ext_off]);
		np->id_len = l = ext_off + np->ext_len;

		/* Make an offset of the number which is used to be set
		 * hexadecimal number to avoid duplicate identifier. */
		if (iso9660->opt.iso_level == 1) {
			if (ext_off >= 5)
				noff = 5;
			else
				noff = ext_off;
		} else {
			if (l == ffmax)
				noff = ext_off - 3;
			else if (l == ffmax-1)
				noff = ext_off - 2;
			else if (l == ffmax-2)
				noff = ext_off - 1;
			else
				noff = ext_off;
		}
		/* Register entry to the identifier resolver. */
		idr_register(idr, np, weight, noff);
	}

	/* Resolve duplicate identifier. */
	idr_resolve(idr, idr_set_num);

	/* Add a period and a version number to identifiers. */
	for (np = isoent->children.first; np != NULL; np = np->chnext) {
		if (!np->dir && np->rr_child == NULL) {
			p = np->identifier + np->ext_off + np->ext_len;
			if (np->ext_len == 0 && allow_period) {
				*p++ = '.';
				np->ext_len = 1;
			}
			if (np->ext_len == 1 && !allow_period) {
				*--p = '\0';
				np->ext_len = 0;
			}
			np->id_len = np->ext_off + np->ext_len;
			if (allow_vernum) {
				*p++ = ';';
				*p++ = '1';
				np->id_len += 2;
			}
			*p = '\0';
		} else
			np->id_len = np->ext_off + np->ext_len;
		np->mb_len = np->id_len;
	}
	return (ARCHIVE_OK);
}